

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# is_present.c
# Opt level: O0

_Bool is_present(char letter,char *word)

{
  long local_20;
  size_t n;
  char *word_local;
  char letter_local;
  
  local_20 = 0;
  while( true ) {
    if (word[local_20] == '\0') {
      return false;
    }
    if (word[local_20] == letter) break;
    local_20 = local_20 + 1;
  }
  return true;
}

Assistant:

bool is_present(char letter, char* word) {
  size_t n = 0;
  while (word[n]) {
    if (word[n] == letter) return true;
    n++;
  }
  return false;
}